

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

P_Sequence * parse(s_i *prog)

{
  pointer ppPVar1;
  undefined1 auVar2 [16];
  undefined1 uVar3;
  uint uVar4;
  Token *pTVar5;
  long *plVar6;
  _func_int **pp_Var7;
  uint uVar8;
  uint uVar9;
  pointer pDVar10;
  bool bVar11;
  char cVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  DirectionAlternation *this;
  undefined8 *puVar18;
  long lVar19;
  undefined8 *puVar20;
  long lVar21;
  Pattern *pPVar22;
  P_Sequence *pPVar23;
  T_Quantifier *tq;
  pointer ppTVar24;
  pointer pDVar25;
  pointer ppTVar26;
  Pattern *pPVar27;
  _Vector_base<Direction,_std::allocator<Direction>_> local_f8;
  Token *tok;
  pointer ppPStack_d0;
  pointer local_c8;
  undefined1 local_b8 [16];
  char *local_a8;
  Token *tok_2;
  vector<Token_*,_std::allocator<Token_*>_> tokens0;
  vector<Token_*,_std::allocator<Token_*>_> tokens1;
  _Vector_base<Token_*,_std::allocator<Token_*>_> local_48;
  
  tokens0.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tokens0.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tokens0.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  do {
    iVar14 = s_i::get(prog);
    switch(iVar14) {
    case 0x5c:
      puVar20 = (undefined8 *)operator_new(0x10);
      puVar18 = (undefined8 *)operator_new(0x10);
      iVar14 = s_i::get(prog);
      *puVar18 = &PTR__Pattern_001148a0;
      *(int *)(puVar18 + 1) = iVar14;
      *puVar20 = &PTR__Token_001147c0;
      puVar20[1] = puVar18;
      local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
      std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
      break;
    case 0x5d:
    case 0x5f:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x70:
    case 0x71:
    case 0x76:
    case 0x78:
      goto switchD_0010a448_caseD_5d;
    case 0x5e:
      puVar20 = (undefined8 *)operator_new(0x10);
      puVar18 = (undefined8 *)operator_new(0x10);
      iVar14 = s_i::get(prog);
      *puVar18 = &PTR__Pattern_001148f0;
      *(int *)(puVar18 + 1) = iVar14;
      *puVar20 = &PTR__Token_001147c0;
      puVar20[1] = puVar18;
      local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
      std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
      break;
    case 0x60:
      puVar20 = (undefined8 *)operator_new(8);
      *puVar20 = &PTR__Token_00114ae8;
      local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
      std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
      break;
    case 0x61:
    case 0x62:
    case 99:
    case 100:
    case 0x65:
    case 0x66:
    case 0x6c:
    case 0x6e:
    case 0x6f:
    case 0x72:
    case 0x73:
    case 0x75:
    case 0x77:
    case 0x79:
    case 0x7a:
      s_i::back(prog);
      puVar20 = (undefined8 *)operator_new(0x10);
      this = (DirectionAlternation *)operator_new(0x20);
      read_dirs((vector<Direction,_std::allocator<Direction>_> *)&local_f8,prog,true);
      AST::DirectionAlternation::DirectionAlternation
                (this,(vector<Direction,_std::allocator<Direction>_> *)&local_f8);
      *puVar20 = &PTR__Token_001147c0;
      puVar20[1] = this;
      tok = (Token *)puVar20;
      std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&tokens0,&tok);
      std::_Vector_base<Direction,_std::allocator<Direction>_>::~_Vector_base(&local_f8);
      break;
    case 0x74:
      puVar20 = (undefined8 *)operator_new(0x10);
      puVar18 = (undefined8 *)operator_new(8);
      *puVar18 = &PTR__Pattern_00114bc8;
      *puVar20 = &PTR__Token_001147c0;
      puVar20[1] = puVar18;
      local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
      std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
      break;
    case 0x7b:
      puVar20 = (undefined8 *)operator_new(0x10);
      *puVar20 = &PTR__Token_00114a08;
      *(undefined4 *)(puVar20 + 1) = 2;
      local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
      std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
      break;
    case 0x7c:
      puVar20 = (undefined8 *)operator_new(8);
      *puVar20 = &PTR__Token_00114998;
      local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
      std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
      break;
    case 0x7d:
      puVar20 = (undefined8 *)operator_new(0x10);
      *puVar20 = &PTR__Token_00114a78;
      *(undefined4 *)(puVar20 + 1) = 2;
      local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
      std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
      break;
    case 0x7e:
      puVar20 = (undefined8 *)operator_new(0x10);
      puVar18 = (undefined8 *)operator_new(8);
      *puVar18 = &PTR__Pattern_00114960;
      *puVar20 = &PTR__Token_001147c0;
      puVar20[1] = puVar18;
      local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
      std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
      break;
    default:
      switch(iVar14) {
      case 9:
      case 10:
      case 0xd:
      case 0x20:
        break;
      case 0x21:
        puVar20 = (undefined8 *)operator_new(0x20);
        *puVar20 = &PTR__Token_00114b58;
        *(undefined1 *)(puVar20 + 1) = 0;
        *(undefined1 (*) [16])(puVar20 + 2) = (undefined1  [16])0x0;
        local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
        std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
        break;
      case 0x28:
        puVar20 = (undefined8 *)operator_new(0x10);
        *puVar20 = &PTR__Token_00114a08;
        *(undefined4 *)(puVar20 + 1) = 1;
        local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
        std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
        break;
      case 0x29:
        puVar20 = (undefined8 *)operator_new(0x10);
        *puVar20 = &PTR__Token_00114a78;
        *(undefined4 *)(puVar20 + 1) = 1;
        local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
        std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
        break;
      case 0x2b:
        iVar14 = s_i::peek(prog,0);
        if (iVar14 == 0x3f) {
          s_i::get(prog);
          puVar20 = (undefined8 *)operator_new(0x10);
          *puVar20 = &PTR__Token_00114830;
          puVar20[1] = 0x1ffffffff;
          local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
          std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                    ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
        }
        else {
          puVar20 = (undefined8 *)operator_new(0x10);
          *puVar20 = &PTR__Token_00114830;
          puVar20[1] = 0xffffffff00000001;
          local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
          std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                    ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
        }
        break;
      case 0x2c:
        iVar14 = s_i::peek(prog,0);
        if (iVar14 == 0x2c) {
          skip_comment(prog);
        }
        else {
          iVar17 = s_i::peek(prog,0);
          iVar14 = -1;
          if (iVar17 - 0x30U < 10) {
            iVar14 = read_num(prog);
          }
          puVar20 = (undefined8 *)operator_new(0x10);
          *puVar20 = &PTR__Token_00114830;
          *(undefined4 *)(puVar20 + 1) = 0;
          *(int *)((long)puVar20 + 0xc) = iVar14;
          local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
          std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                    ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
        }
        break;
      case 0x2e:
        puVar20 = (undefined8 *)operator_new(0x10);
        puVar18 = (undefined8 *)operator_new(8);
        *puVar18 = &PTR__Pattern_00114928;
        *puVar20 = &PTR__Token_001147c0;
        puVar20[1] = puVar18;
        local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
        std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
        break;
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
        s_i::back(prog);
        iVar17 = read_num(prog);
        iVar15 = s_i::peek(prog,0);
        iVar14 = iVar17;
        if ((iVar15 == 0x2c) && (iVar15 = s_i::peek(prog,1), iVar15 != 0x2c)) {
          s_i::get(prog);
          iVar15 = s_i::peek(prog,0);
          iVar14 = -1;
          if (iVar15 - 0x30U < 10) {
            iVar14 = read_num(prog);
          }
        }
        puVar20 = (undefined8 *)operator_new(0x10);
        *puVar20 = &PTR__Token_00114830;
        *(int *)(puVar20 + 1) = iVar17;
        *(int *)((long)puVar20 + 0xc) = iVar14;
        local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
        std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
        break;
      case 0x3d:
        puVar20 = (undefined8 *)operator_new(0x20);
        *puVar20 = &PTR__Token_00114b58;
        *(undefined1 *)(puVar20 + 1) = 1;
        *(undefined1 (*) [16])(puVar20 + 2) = (undefined1  [16])0x0;
        local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
        std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
        break;
      case 0x3f:
        iVar14 = s_i::peek(prog,0);
        if (iVar14 == 0x3f) {
          s_i::get(prog);
          puVar20 = (undefined8 *)operator_new(0x10);
          *puVar20 = &PTR__Token_00114830;
          puVar20[1] = 1;
          local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
          std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                    ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
        }
        else {
          puVar20 = (undefined8 *)operator_new(0x10);
          *puVar20 = &PTR__Token_00114830;
          puVar20[1] = 0x100000000;
          local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)puVar20;
          std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                    ((vector<Token*,std::allocator<Token*>> *)&tokens0,(Token **)&local_f8);
        }
        break;
      default:
        if (iVar14 == -1) {
          std::vector<Token_*,_std::allocator<Token_*>_>::vector
                    ((vector<Token_*,_std::allocator<Token_*>_> *)&local_48,&tokens0);
          local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          puVar20 = (undefined8 *)0x0;
          ppTVar24 = local_48._M_impl.super__Vector_impl_data._M_start;
          goto LAB_0010a9ea;
        }
      case 0xb:
      case 0xc:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x1f:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x2a:
      case 0x2d:
      case 0x2f:
      case 0x3a:
      case 0x3b:
      case 0x3c:
      case 0x3e:
switchD_0010a448_caseD_5d:
        puVar20 = (undefined8 *)__cxa_allocate_exception(0x18);
        iVar14 = *(int *)&prog->i;
        iVar17 = *(int *)&(prog->s->_M_dataplus)._M_p;
        *puVar20 = &PTR__exception_001146d0;
        puVar20[1] = "Unrecognized instruction";
        *(int *)(puVar20 + 2) = iVar14 - iVar17;
        __cxa_throw(puVar20,&parse_exc::typeinfo,std::exception::~exception);
      }
    }
  } while( true );
LAB_0010a9ea:
  if (ppTVar24 == local_48._M_impl.super__Vector_impl_data._M_finish) goto LAB_0010aad8;
  pTVar5 = *ppTVar24;
  tok = pTVar5;
  if (pTVar5 == (Token *)0x0) {
LAB_0010aac0:
    std::vector<Token_*,_std::allocator<Token_*>_>::push_back
              ((vector<Token_*,_std::allocator<Token_*>_> *)&local_f8,&tok);
    puVar20 = (undefined8 *)0x0;
  }
  else {
    lVar19 = __dynamic_cast(pTVar5,&Token::typeinfo,&T_Assert::typeinfo,0);
    if (lVar19 == 0) {
      if ((puVar20 == (undefined8 *)0x0) ||
         (lVar19 = __dynamic_cast(pTVar5,&Token::typeinfo,&T_Pattern::typeinfo,0), lVar19 == 0))
      goto LAB_0010aac0;
      if ((puVar20[2] == 0) &&
         (bVar11 = isA<AST::Teleport,AST::Pattern>(*(Pattern **)(lVar19 + 8)), bVar11)) {
        puVar20[2] = *(undefined8 *)(lVar19 + 8);
      }
      else {
        if ((puVar20[3] != 0) ||
           (bVar11 = isA<AST::DirectionAlternation,AST::Pattern>(*(Pattern **)(lVar19 + 8)), !bVar11
           )) goto LAB_0010aac0;
        puVar20[3] = *(undefined8 *)(lVar19 + 8);
      }
    }
    else {
      puVar20 = (undefined8 *)operator_new(0x20);
      uVar3 = *(undefined1 *)(lVar19 + 8);
      *puVar20 = &PTR__Token_00114b58;
      *(undefined1 *)(puVar20 + 1) = uVar3;
      *(undefined1 (*) [16])(puVar20 + 2) = (undefined1  [16])0x0;
      local_b8._0_8_ = puVar20;
      std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_f8,(Token **)local_b8);
    }
  }
  ppTVar24 = ppTVar24 + 1;
  goto LAB_0010a9ea;
LAB_0010aad8:
  tokens1.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tokens1.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tokens1.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if ((insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::cat == '\0') &&
     (iVar14 = __cxa_guard_acquire(&insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)
                                    ::cat), iVar14 != 0)) {
    __cxa_guard_release(&insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::cat
                       );
  }
  if ((insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty == '\0') &&
     (iVar14 = __cxa_guard_acquire(&insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)
                                    ::empty), iVar14 != 0)) {
    insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty._8_8_ =
         operator_new(8);
    *(undefined ***)
     insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty._8_8_ =
         &PTR__Pattern_00114c70;
    insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty._0_8_ =
         &PTR__Token_001147c0;
    __cxa_guard_release(&insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::
                         empty);
  }
  puVar20 = (undefined8 *)operator_new(0x10);
  *puVar20 = &PTR__Token_00114a08;
  *(undefined4 *)(puVar20 + 1) = 0;
  tok = (Token *)puVar20;
  std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
            ((vector<Token*,std::allocator<Token*>> *)&tokens1,&tok);
  pDVar10 = local_f8._M_impl.super__Vector_impl_data._M_finish;
  bVar11 = true;
  uVar16 = 0;
  local_a8 = "Nothing to assert";
  for (pDVar25 = local_f8._M_impl.super__Vector_impl_data._M_start; pDVar25 != pDVar10;
      pDVar25 = (pointer)(pDVar25->x + 1)) {
    tok = (Token *)*(long **)pDVar25;
    cVar12 = (**(code **)(**(long **)pDVar25 + 0x20))();
    if (cVar12 == '\0') {
      iVar14 = (*tok->_vptr_Token[2])();
      if ((char)iVar14 != '\0') goto LAB_0010ab87;
      iVar14 = (*tok->_vptr_Token[6])();
      if ((char)iVar14 == '\0') {
        if ((uVar16 & 1) != 0) {
LAB_0010b346:
          puVar20 = (undefined8 *)__cxa_allocate_exception(0x18);
          *puVar20 = &PTR__exception_001146d0;
          puVar20[1] = local_a8;
          *(undefined4 *)(puVar20 + 2) = 0xffffffff;
          __cxa_throw(puVar20,&parse_exc::typeinfo,std::exception::~exception);
        }
        bVar13 = isA<T_Alternator,Token>(tok);
        if (bVar13) {
          if (bVar11) {
            local_b8._0_8_ =
                 insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty;
            std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                      ((vector<Token*,std::allocator<Token*>> *)&tokens1,(Token **)local_b8);
          }
          goto LAB_0010ac27;
        }
        iVar14 = (*tok->_vptr_Token[5])();
        if ((char)iVar14 != '\0') {
          if (bVar11) {
            local_a8 = "Nothing to quantify";
            goto LAB_0010b346;
          }
          goto LAB_0010ac2a;
        }
        iVar14 = (*tok->_vptr_Token[7])();
        if ((char)iVar14 == '\0') {
          __assert_fail("tok->isGroupCloser()",
                        "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                        ,0x125,"vector<Token *> insert_concatenators(const vector<Token *> &)");
        }
        if (bVar11) {
          local_b8._0_8_ =
               insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty;
          std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                    ((vector<Token*,std::allocator<Token*>> *)&tokens1,(Token **)local_b8);
        }
LAB_0010ab97:
        bVar11 = false;
      }
      else {
        if (((uVar16 & 1) == 0) && (!bVar11)) {
          local_b8._0_8_ =
               &insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::cat;
          std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                    ((vector<Token*,std::allocator<Token*>> *)&tokens1,(Token **)local_b8);
        }
LAB_0010ac27:
        bVar11 = true;
      }
    }
    else {
LAB_0010ab87:
      if ((uVar16 & 1) == 0) {
        if (bVar11) goto LAB_0010ab97;
        local_b8._0_8_ =
             &insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::cat;
        std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&tokens1,(Token **)local_b8);
      }
    }
LAB_0010ac2a:
    std::vector<Token_*,_std::allocator<Token_*>_>::push_back(&tokens1,&tok);
    uVar16 = (*tok->_vptr_Token[4])();
  }
  if ((uVar16 & 1) != 0) {
    puVar20 = (undefined8 *)__cxa_allocate_exception(0x18);
    *puVar20 = &PTR__exception_001146d0;
    puVar20[1] = "Nothing to assert";
    *(undefined4 *)(puVar20 + 2) = 0xffffffff;
    __cxa_throw(puVar20,&parse_exc::typeinfo,std::exception::~exception);
  }
  if (bVar11) {
    tok = (Token *)insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty;
    std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&tokens1,&tok);
  }
  puVar20 = (undefined8 *)operator_new(0x10);
  *puVar20 = &PTR__Token_00114a78;
  *(undefined4 *)(puVar20 + 1) = 0;
  tok = (Token *)puVar20;
  std::vector<Token*,std::allocator<Token*>>::emplace_back<Token*>
            ((vector<Token*,std::allocator<Token*>> *)&tokens1,&tok);
  std::_Vector_base<Token_*,_std::allocator<Token_*>_>::~_Vector_base
            ((_Vector_base<Token_*,_std::allocator<Token_*>_> *)&local_f8);
  std::_Vector_base<Token_*,_std::allocator<Token_*>_>::~_Vector_base(&local_48);
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _tok = (undefined1  [16])0x0;
  local_c8 = (pointer)0x0;
  ppTVar24 = tokens1.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_a8 = (char *)CONCAT44(local_a8._4_4_,(int)CONCAT71((int7)((ulong)&tok >> 8),1));
  ppTVar26 = tokens1.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    if (ppTVar26 == ppTVar24) {
      if ((long)ppPStack_d0 - (long)tok != 8) {
        __assert_fail("pstk.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                      ,0x182,"AST::Pattern *parse_tokenized(vector<Token *> &)");
      }
      if (local_f8._M_impl.super__Vector_impl_data._M_finish ==
          local_f8._M_impl.super__Vector_impl_data._M_start) {
        pPVar27 = ppPStack_d0[-1];
        ppPStack_d0 = ppPStack_d0 + -1;
        std::_Vector_base<AST::Pattern_*,_std::allocator<AST::Pattern_*>_>::~_Vector_base
                  ((_Vector_base<AST::Pattern_*,_std::allocator<AST::Pattern_*>_> *)&tok);
        std::_Vector_base<Token_*,_std::allocator<Token_*>_>::~_Vector_base
                  ((_Vector_base<Token_*,_std::allocator<Token_*>_> *)&local_f8);
        pPVar23 = compile_top(pPVar27);
        std::_Vector_base<Token_*,_std::allocator<Token_*>_>::~_Vector_base
                  (&tokens1.super__Vector_base<Token_*,_std::allocator<Token_*>_>);
        std::_Vector_base<Token_*,_std::allocator<Token_*>_>::~_Vector_base
                  (&tokens0.super__Vector_base<Token_*,_std::allocator<Token_*>_>);
        return pPVar23;
      }
      __assert_fail("opstk.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                    ,0x183,"AST::Pattern *parse_tokenized(vector<Token *> &)");
    }
    tok_2 = *ppTVar26;
    iVar14 = (*tok_2->_vptr_Token[5])();
    pTVar5 = tok_2;
    if ((char)iVar14 == '\0') {
      iVar14 = (*tok_2->_vptr_Token[4])(tok_2);
      if (((char)iVar14 == '\0') && (iVar14 = (*tok_2->_vptr_Token[6])(), (char)iVar14 == '\0')) {
        iVar14 = (*tok_2->_vptr_Token[2])();
        if ((char)iVar14 == '\0') {
          if (((ulong)local_a8 & 1) != 0) {
            __assert_fail("!expectAtom",
                          "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                          ,0x15c,"AST::Pattern *parse_tokenized(vector<Token *> &)");
          }
LAB_0010ae7e:
          pTVar5 = tok_2;
          plVar6 = *(long **)local_f8._M_impl.super__Vector_impl_data._M_finish[-1].x;
          iVar14 = (*tok_2->_vptr_Token[8])(tok_2);
          iVar17 = (**(code **)(*plVar6 + 0x40))(plVar6);
          if (iVar14 <= iVar17) {
LAB_0010af01:
            pTVar5 = *(Token **)local_f8._M_impl.super__Vector_impl_data._M_finish[-1].x;
            local_f8._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)local_f8._M_impl.super__Vector_impl_data._M_finish[-1].x;
            iVar14 = (*pTVar5->_vptr_Token[4])(pTVar5);
            if ((char)iVar14 == '\0') {
              iVar14 = (*pTVar5->_vptr_Token[3])(pTVar5);
              if ((char)iVar14 != '\0') {
                bVar11 = isA<T_Concatenation,Token>(pTVar5);
                if (bVar11) {
                  puVar20 = (undefined8 *)operator_new(0x18);
                  *puVar20 = &PTR__Pattern_00114d30;
                }
                else {
                  bVar11 = isA<T_Alternator,Token>(pTVar5);
                  if (!bVar11) {
                    __assert_fail("isA<T_Alternator>(op)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                                  ,0x174,"AST::Pattern *parse_tokenized(vector<Token *> &)");
                  }
                  puVar20 = (undefined8 *)operator_new(0x18);
                  *puVar20 = &PTR__Pattern_00114d80;
                }
                puVar20[2] = ppPStack_d0[-1];
                ppPVar1 = ppPStack_d0 + -2;
                ppPStack_d0 = ppPStack_d0 + -2;
                puVar20[1] = *ppPVar1;
                local_b8._0_8_ = puVar20;
                std::vector<AST::Pattern*,std::allocator<AST::Pattern*>>::
                emplace_back<AST::Pattern*>
                          ((vector<AST::Pattern*,std::allocator<AST::Pattern*>> *)&tok,
                           (Pattern **)local_b8);
              }
            }
            else {
              lVar19 = __dynamic_cast(pTVar5,&Token::typeinfo,&T_Assert::typeinfo,0);
              if (lVar19 == 0) {
                __assert_fail("ta",
                              "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                              ,0x161,"AST::Pattern *parse_tokenized(vector<Token *> &)");
              }
              puVar20 = (undefined8 *)operator_new(0x18);
              *puVar20 = &PTR__Pattern_00114cf8;
              *(undefined1 *)(puVar20 + 2) = *(undefined1 *)(lVar19 + 8);
              ppPVar1 = ppPStack_d0 + -1;
              ppPStack_d0 = ppPStack_d0 + -1;
              auVar2 = *(undefined1 (*) [16])(lVar19 + 0x10);
              local_b8._0_8_ = auVar2._8_8_;
              local_b8._8_4_ = auVar2._0_4_;
              local_b8._12_4_ = auVar2._4_4_;
              pPVar27 = *ppPVar1;
              for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 8) {
                pp_Var7 = *(_func_int ***)(local_b8 + lVar19);
                pPVar22 = pPVar27;
                if (pp_Var7 != (_func_int **)0x0) {
                  pPVar22 = (Pattern *)operator_new(0x18);
                  pPVar22->_vptr_Pattern = (_func_int **)&PTR__Pattern_00114d30;
                  pPVar22[1]._vptr_Pattern = pp_Var7;
                  pPVar22[2]._vptr_Pattern = (_func_int **)pPVar27;
                }
                pPVar27 = pPVar22;
              }
              puVar20[1] = pPVar27;
              local_b8._0_8_ = puVar20;
              std::vector<AST::Pattern*,std::allocator<AST::Pattern*>>::emplace_back<AST::Pattern*>
                        ((vector<AST::Pattern*,std::allocator<AST::Pattern*>> *)&tok,
                         (Pattern **)local_b8);
            }
            goto LAB_0010ae7e;
          }
          lVar19 = __dynamic_cast(pTVar5,&Token::typeinfo,&T_GroupClose::typeinfo,0);
          if (lVar19 == 0) goto LAB_0010b065;
          lVar21 = __dynamic_cast(plVar6,&Token::typeinfo,&T_GroupOpen::typeinfo,0);
          if (lVar21 == 0) {
            __assert_fail("topgo",
                          "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                          ,0x13e,"bool should_eval(Token *, vector<Token *> &)");
          }
          if (*(int *)(lVar21 + 8) != *(int *)(lVar19 + 8)) {
            if (*(int *)(lVar21 + 8) == 0) goto LAB_0010b065;
            goto LAB_0010af01;
          }
          local_f8._M_impl.super__Vector_impl_data._M_finish =
               (pointer)local_f8._M_impl.super__Vector_impl_data._M_finish[-1].x;
LAB_0010b065:
          iVar14 = (*tok_2->_vptr_Token[3])();
          if ((char)iVar14 != '\0') {
            local_a8 = (char *)CONCAT44(local_a8._4_4_,
                                        (int)CONCAT71((uint7)(uint3)((uint)iVar14 >> 8),1));
            std::vector<Token_*,_std::allocator<Token_*>_>::push_back
                      ((vector<Token_*,_std::allocator<Token_*>_> *)&local_f8,&tok_2);
          }
        }
        else {
          if (((ulong)local_a8 & 1) == 0) {
            __assert_fail("expectAtom",
                          "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                          ,0x156,"AST::Pattern *parse_tokenized(vector<Token *> &)");
          }
          if ((tok_2 == (Token *)0x0) ||
             (lVar19 = __dynamic_cast(tok_2,&Token::typeinfo,&T_Pattern::typeinfo,0), lVar19 == 0))
          {
            __assert_fail("tp",
                          "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                          ,0x159,"AST::Pattern *parse_tokenized(vector<Token *> &)");
          }
          std::vector<AST::Pattern_*,_std::allocator<AST::Pattern_*>_>::push_back
                    ((vector<AST::Pattern_*,_std::allocator<AST::Pattern_*>_> *)&tok,
                     (value_type *)(lVar19 + 8));
          local_a8 = (char *)((ulong)local_a8 & 0xffffffff00000000);
        }
      }
      else {
        if (((ulong)local_a8 & 1) == 0) {
          __assert_fail("expectAtom",
                        "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                        ,0x153,"AST::Pattern *parse_tokenized(vector<Token *> &)");
        }
        std::vector<Token_*,_std::allocator<Token_*>_>::push_back
                  ((vector<Token_*,_std::allocator<Token_*>_> *)&local_f8,&tok_2);
      }
    }
    else {
      puVar20 = (undefined8 *)operator_new(0x20);
      uVar16 = *(uint *)&pTVar5[1]._vptr_Token;
      uVar4 = *(uint *)((long)&pTVar5[1]._vptr_Token + 4);
      uVar8 = uVar16;
      uVar9 = uVar4;
      if (uVar4 < uVar16) {
        uVar8 = uVar4;
        uVar9 = uVar16;
      }
      *puVar20 = &PTR__Pattern_00114ca8;
      *(uint *)(puVar20 + 2) = uVar8;
      *(uint *)((long)puVar20 + 0x14) = uVar9;
      *(bool *)(puVar20 + 3) = uVar4 < uVar16;
      ppPVar1 = ppPStack_d0 + -1;
      ppPStack_d0 = ppPStack_d0 + -1;
      puVar20[1] = *ppPVar1;
      local_b8._0_8_ = puVar20;
      std::vector<AST::Pattern*,std::allocator<AST::Pattern*>>::emplace_back<AST::Pattern*>
                ((vector<AST::Pattern*,std::allocator<AST::Pattern*>> *)&tok,(Pattern **)local_b8);
    }
    ppTVar26 = ppTVar26 + 1;
  } while( true );
}

Assistant:

P_Sequence * parse(s_i &prog) {
    auto tokens0 = tokenize(prog);
    auto tokens1 = insert_concatenators(attach_assertion_directions(tokens0));
#ifdef DEBUG_PARSER
    std::cerr << "Preliminary tokens:";
    for (Token* t : tokens0) std::cerr << ' ' << (str)*t;
    std::cerr << "\nModified tokens:";
    for (Token* t : tokens1) std::cerr << ' ' << (str)*t;
    std::cerr << '\n';
#endif
    return compile_top(parse_tokenized(tokens1));
}